

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  string_view s;
  string_view s_00;
  string *local_100;
  string_view local_d0;
  undefined1 local_c0 [16];
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string *local_90;
  string local_88;
  string local_68;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char **args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_90 = &local_88;
  local_28 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char **)format;
  format_local = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,*args);
  s._M_str = (char *)args_1;
  s._M_len = (size_t)local_a0._M_str;
  ToString_abi_cxx11_(&local_88,(Formatter *)local_a0._M_len,s);
  local_90 = &local_68;
  local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
  s_00._M_len = local_c0._8_8_;
  s_00._M_str = (char *)args_1;
  ToString_abi_cxx11_(&local_68,local_c0._0_8_,s_00);
  local_48 = &local_88;
  local_40 = 2;
  v._M_len = 2;
  v._M_array = local_48;
  absl::lts_20240722::Span<std::__cxx11::string_const>::
  Span<std::__cxx11::string_const,std::__cxx11::string_const>
            ((Span<std::__cxx11::string_const> *)local_38._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,(char *)args_local);
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_38,&this->vars_,local_d0);
  local_100 = (string *)&local_48;
  do {
    local_100 = local_100 + -1;
    std::__cxx11::string::~string((string *)local_100);
  } while (local_100 != &local_88);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }